

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasthessian.cpp
# Opt level: O3

response_layer * initialise_response_layer(int filter_size,int width,int height,int init_step)

{
  response_layer *prVar1;
  float *pfVar2;
  bool *pbVar3;
  
  prVar1 = (response_layer *)malloc(0x20);
  prVar1->filter_size = filter_size;
  prVar1->width = width;
  prVar1->height = height;
  prVar1->step = init_step;
  pfVar2 = (float *)malloc((long)(height * width) * 4);
  prVar1->response = pfVar2;
  pbVar3 = (bool *)malloc((long)(height * width));
  prVar1->laplacian = pbVar3;
  return prVar1;
}

Assistant:

struct response_layer* initialise_response_layer(int filter_size, int width, int height, int init_step){
    // initialise memory for struct
    struct response_layer* layer = (struct response_layer *) malloc(sizeof(struct response_layer));

    // set variables
    layer->filter_size = filter_size;
    layer->width = width;
    layer->height = height;
    layer->step = init_step;

    // malloc arrays
    layer->response = (float*) malloc(width * height * sizeof(float));
    layer->laplacian = (bool*) malloc(width * height * sizeof(bool));

    return layer;
}